

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

void __thiscall
duckdb::LogManager::SetLogStorage(LogManager *this,DatabaseInstance *db,string *storage_name)

{
  string *__lhs;
  shared_ptr<duckdb::LogStorage,_true> *this_00;
  __type _Var1;
  bool bVar2;
  LogStorage *pLVar3;
  iterator iVar4;
  mapped_type *other;
  NotImplementedException *this_01;
  InvalidInputException *this_02;
  allocator local_a1;
  undefined1 local_a0 [32];
  string storage_name_to_lower;
  unique_lock<std::mutex> lck;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::unique_lock<std::mutex>::unique_lock(&lck,&this->lock);
  StringUtil::Lower((string *)&storage_name_to_lower,(string *)storage_name);
  __lhs = &(this->config).storage;
  _Var1 = ::std::operator==(__lhs,&storage_name_to_lower);
  if (_Var1) goto LAB_017e5a95;
  this_00 = &this->log_storage;
  pLVar3 = shared_ptr<duckdb::LogStorage,_true>::operator->(this_00);
  (*pLVar3->_vptr_LogStorage[4])(pLVar3);
  bVar2 = ::std::operator==(&storage_name_to_lower,"memory");
  if (bVar2) {
    make_shared_ptr<duckdb::InMemoryLogStorage,duckdb::DatabaseInstance&>
              ((DatabaseInstance *)local_a0);
    shared_ptr<duckdb::LogStorage,_true>::operator=<duckdb::InMemoryLogStorage,_0>
              (this_00,(shared_ptr<duckdb::InMemoryLogStorage,_true> *)local_a0);
LAB_017e5a32:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  }
  else {
    bVar2 = ::std::operator==(&storage_name_to_lower,"stdout");
    if (bVar2) {
      make_shared_ptr<duckdb::StdOutLogStorage>();
      shared_ptr<duckdb::LogStorage,_true>::operator=<duckdb::StdOutLogStorage,_0>
                (this_00,(shared_ptr<duckdb::StdOutLogStorage,_true> *)local_a0);
      goto LAB_017e5a32;
    }
    bVar2 = ::std::operator==(&storage_name_to_lower,"file");
    if (bVar2) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_a0,"File log storage is not yet implemented",&local_a1);
      NotImplementedException::NotImplementedException(this_01,(string *)local_a0);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar4 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->registered_log_storages)._M_h,&storage_name_to_lower);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_a0,"Log storage \'%s\' is not yet registered",&local_a1);
      ::std::__cxx11::string::string((string *)&local_50,(string *)storage_name);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (this_02,(string *)local_a0,&local_50);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    other = ::std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::LogStorage,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->registered_log_storages,&storage_name_to_lower);
    shared_ptr<duckdb::LogStorage,_true>::operator=(this_00,other);
  }
  ::std::__cxx11::string::_M_assign((string *)__lhs);
LAB_017e5a95:
  ::std::__cxx11::string::~string((string *)&storage_name_to_lower);
  ::std::unique_lock<std::mutex>::~unique_lock(&lck);
  return;
}

Assistant:

void LogManager::SetLogStorage(DatabaseInstance &db, const string &storage_name) {
	unique_lock<mutex> lck(lock);
	auto storage_name_to_lower = StringUtil::Lower(storage_name);

	if (config.storage == storage_name_to_lower) {
		return;
	}

	// Flush the old storage, we are going to replace it.
	log_storage->Flush();

	if (storage_name_to_lower == LogConfig::IN_MEMORY_STORAGE_NAME) {
		log_storage = make_shared_ptr<InMemoryLogStorage>(db);
	} else if (storage_name_to_lower == LogConfig::STDOUT_STORAGE_NAME) {
		log_storage = make_shared_ptr<StdOutLogStorage>();
	} else if (storage_name_to_lower == LogConfig::FILE_STORAGE_NAME) {
		throw NotImplementedException("File log storage is not yet implemented");
	} else if (registered_log_storages.find(storage_name_to_lower) != registered_log_storages.end()) {
		log_storage = registered_log_storages[storage_name_to_lower];
	} else {
		throw InvalidInputException("Log storage '%s' is not yet registered", storage_name);
	}
	config.storage = storage_name_to_lower;
}